

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

_Bool container_is_full(container_t *c,uint8_t typecode)

{
  undefined3 in_register_00000031;
  uint uVar1;
  _Bool _Var2;
  
  uVar1 = CONCAT31(in_register_00000031,typecode);
  if (uVar1 == 4) {
    uVar1 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar1 != '\x03') {
    return *c == 0x10000;
  }
  _Var2 = false;
  if ((*c == 1) && (_Var2 = false, **(short **)((long)c + 8) == 0)) {
    _Var2 = (*(short **)((long)c + 8))[1] == -1;
  }
  return _Var2;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}